

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MinimumValueCase::MinimumValueCase
          (MinimumValueCase *this,Context *context,char *name,char *desc,GLenum target,int minValue,
          QueryType verifierType)

{
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e58738;
  this->m_target = target;
  this->m_minValue = minValue;
  this->m_verifierType = verifierType;
  (this->m_minimumVersion).m_bits = 0x13;
  return;
}

Assistant:

MinimumValueCase::MinimumValueCase (Context& context, const char* name, const char* desc, glw::GLenum target, int minValue, QueryType verifierType)
	: TestCase			(context, name, desc)
	, m_target			(target)
	, m_minValue		(minValue)
	, m_verifierType	(verifierType)
	, m_minimumVersion	(glu::ApiType::es(3, 1))
{
}